

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall Lib::Stack<unsigned_int>::Stack(Stack<unsigned_int> *this,size_t initialCapacity)

{
  uint *puVar1;
  size_t sVar2;
  ulong uVar3;
  
  this->_capacity = initialCapacity;
  if (initialCapacity == 0) {
    this->_stack = (uint *)0x0;
    sVar2 = 0;
    puVar1 = (uint *)0x0;
  }
  else {
    uVar3 = initialCapacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar3 == 0) {
      puVar1 = (uint *)FixedSizeAllocator<8UL>::alloc
                                 ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar3 < 0x11) {
      puVar1 = (uint *)FixedSizeAllocator<16UL>::alloc
                                 ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                                 );
    }
    else if (uVar3 < 0x19) {
      puVar1 = (uint *)FixedSizeAllocator<24UL>::alloc
                                 ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30)
                                 );
    }
    else if (uVar3 < 0x21) {
      puVar1 = (uint *)FixedSizeAllocator<32UL>::alloc
                                 ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48)
                                 );
    }
    else if (uVar3 < 0x31) {
      puVar1 = (uint *)FixedSizeAllocator<48UL>::alloc
                                 ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                                 );
    }
    else if (uVar3 < 0x41) {
      puVar1 = (uint *)FixedSizeAllocator<64UL>::alloc
                                 ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78)
                                 );
    }
    else {
      puVar1 = (uint *)::operator_new(uVar3,0x10);
    }
    this->_stack = puVar1;
    sVar2 = this->_capacity;
  }
  this->_cursor = puVar1;
  this->_end = puVar1 + sVar2;
  return;
}

Assistant:

inline
  explicit Stack (size_t initialCapacity=0)
    : _capacity(initialCapacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = nullptr;
    }
    _cursor = _stack;
    _end = _stack+_capacity;
  }